

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int stream_is_destroyable(quicly_stream_t *stream)

{
  int iVar1;
  long in_RDI;
  int local_4;
  
  iVar1 = quicly_recvstate_transfer_complete((quicly_recvstate_t *)(in_RDI + 0x78));
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = quicly_sendstate_transfer_complete((quicly_sendstate_t *)(in_RDI + 0x18));
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else if ((*(int *)(in_RDI + 0xd0) == 0) || (*(int *)(in_RDI + 0xd0) == 3)) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int stream_is_destroyable(quicly_stream_t *stream)
{
    if (!quicly_recvstate_transfer_complete(&stream->recvstate))
        return 0;
    if (!quicly_sendstate_transfer_complete(&stream->sendstate))
        return 0;
    switch (stream->_send_aux.reset_stream.sender_state) {
    case QUICLY_SENDER_STATE_NONE:
    case QUICLY_SENDER_STATE_ACKED:
        break;
    default:
        return 0;
    }
    return 1;
}